

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O2

void __thiscall
EOServer::Initialize
          (EOServer *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
          *dbinfo,Config *eoserv_config,Config *admin_config)

{
  World *this_00;
  TimeEvent *pTVar1;
  double dVar2;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
  aStack_e8;
  
  this_00 = (World *)operator_new(0x980);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  array(&aStack_e8,dbinfo);
  World::World(this_00,&aStack_e8,eoserv_config,admin_config);
  this->world = this_00;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  ~array(&aStack_e8);
  pTVar1 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar1,server_check_hangup,this,1.0,-1);
  Timer::Register(&this->world->timer,pTVar1);
  pTVar1 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar1,server_pump_queue,this,0.001,-1);
  Timer::Register(&this->world->timer,pTVar1);
  this->world->server = this;
  dVar2 = Timer::GetTime();
  this->start = dVar2;
  UpdateConfig(this);
  return;
}

Assistant:

void EOServer::Initialize(std::array<std::string, 6> dbinfo, const Config &eoserv_config, const Config &admin_config)
{
	this->world = new World(dbinfo, eoserv_config, admin_config);

	TimeEvent *event = new TimeEvent(server_check_hangup, this, 1.0, Timer::FOREVER);
	this->world->timer.Register(event);

	event = new TimeEvent(server_pump_queue, this, 0.001, Timer::FOREVER);
	this->world->timer.Register(event);

	this->world->server = this;

	this->start = Timer::GetTime();

	this->UpdateConfig();
}